

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

string * Node::PathDecanonicalized(string *__return_storage_ptr__,string *path,uint64_t slash_bits)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

string Node::PathDecanonicalized(const string& path, uint64_t slash_bits) {
  string result = path;
#ifdef _WIN32
  uint64_t mask = 1;
  for (char* c = &result[0]; (c = strchr(c, '/')) != NULL;) {
    if (slash_bits & mask)
      *c = '\\';
    c++;
    mask <<= 1;
  }
#endif
  return result;
}